

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase *
CreateBinaryOp(ExpressionEvalContext *ctx,SynBase *source,ExprBase *lhs,ExprBase *unevaluatedRhs,
              SynBinaryOpType op)

{
  TypeBase *pTVar1;
  bool bVar2;
  ExprIntegerLiteral *pEVar3;
  ExprRationalLiteral *pEVar4;
  ExprPointerLiteral *pEVar5;
  ExprBase *pEVar6;
  double dVar7;
  ExprPointerLiteral *value_1;
  void *rPtr;
  ExprPointerLiteral *value;
  void *lPtr;
  TypeBase *rhsValue_2;
  TypeBase *lhsValue_2;
  double rhsValue_1;
  double lhsValue_1;
  ExprBase *rhs;
  longlong power_1;
  longlong result_1;
  int power;
  int result;
  int rhsValueInt;
  int lhsValueInt;
  TypeBase *resultType;
  ExprBase *rhs_1;
  ExprBase *rhs_3;
  ExprBase *rhs_2;
  longlong rhsValue;
  longlong lhsValue;
  ExprBase *pEStack_30;
  SynBinaryOpType op_local;
  ExprBase *unevaluatedRhs_local;
  ExprBase *lhs_local;
  SynBase *source_local;
  ExpressionEvalContext *ctx_local;
  
  lhsValue._4_4_ = op;
  pEStack_30 = unevaluatedRhs;
  unevaluatedRhs_local = lhs;
  lhs_local = (ExprBase *)source;
  source_local = (SynBase *)ctx;
  bVar2 = isType<TypeError>(lhs->type);
  if ((bVar2) || (bVar2 = isType<TypeError>(pEStack_30->type), bVar2)) {
    pEVar6 = Report((ExpressionEvalContext *)source_local,"ERROR: encountered an error node");
    return pEVar6;
  }
  if (unevaluatedRhs_local->type != pEStack_30->type) {
    __assert_fail("lhs->type == unevaluatedRhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,599,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  bVar2 = ExpressionContext::IsIntegerType
                    ((ExpressionContext *)source_local->_vptr_SynBase,unevaluatedRhs_local->type);
  if (((bVar2) || (bVar2 = isType<TypeEnum>(unevaluatedRhs_local->type), bVar2)) &&
     ((bVar2 = ExpressionContext::IsIntegerType
                         ((ExpressionContext *)source_local->_vptr_SynBase,pEStack_30->type), bVar2
      || (bVar2 = isType<TypeEnum>(pEStack_30->type), bVar2)))) {
    rhsValue = 0;
    rhs_2 = (ExprBase *)0x0;
    if (lhsValue._4_4_ != SYN_BINARY_OP_LOGICAL_AND) {
      if (lhsValue._4_4_ != SYN_BINARY_OP_LOGICAL_OR) {
        resultType = (TypeBase *)Evaluate((ExpressionEvalContext *)source_local,pEStack_30);
        if (resultType == (TypeBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (unevaluatedRhs_local->type == (TypeBase *)(resultType->name).end) {
          _rhsValueInt = source_local->_vptr_SynBase[0x113b];
          if ((unevaluatedRhs_local->type == (TypeBase *)source_local->_vptr_SynBase[0x113c]) ||
             ((TypeBase *)(resultType->name).end == (TypeBase *)source_local->_vptr_SynBase[0x113c])
             ) {
            _rhsValueInt = source_local->_vptr_SynBase[0x113c];
          }
          bVar2 = TryTakeLong(unevaluatedRhs_local,&rhsValue);
          if ((bVar2) && (bVar2 = TryTakeLong((ExprBase *)resultType,(longlong *)&rhs_2), bVar2)) {
            if (_rhsValueInt != source_local->_vptr_SynBase[0x113b]) {
              switch(lhsValue._4_4_) {
              case SYN_BINARY_OP_ADD:
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           (long)&rhs_2->_vptr_ExprBase + rhsValue);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_SUB:
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue - (long)rhs_2);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_MUL:
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue * (long)rhs_2);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_DIV:
                goto switchD_00301672_caseD_4;
              case SYN_BINARY_OP_MOD:
                if (rhs_2 == (ExprBase *)0x0) {
                  pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                          "ERROR: modulus division by zero during constant folding")
                  ;
                  return pEVar6;
                }
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue % (long)rhs_2);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_POW:
                if ((long)rhs_2 < 0) {
                  pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                          "ERROR: negative power on integer number in exponentiation during constant folding"
                                         );
                  return pEVar6;
                }
                power_1 = 1;
                for (rhs = rhs_2; rhs != (ExprBase *)0x0; rhs = (ExprBase *)((long)rhs >> 1)) {
                  if (((ulong)rhs & 1) != 0) {
                    power_1 = rhsValue * power_1;
                    rhs = (ExprBase *)&rhs[-1].field_0x2f;
                  }
                  rhsValue = rhsValue * rhsValue;
                }
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,power_1);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_SHL:
                if ((long)rhs_2 < 0) {
                  pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                          "ERROR: negative shift value");
                  return pEVar6;
                }
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue << ((byte)rhs_2 & 0x3f));
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_SHR:
                if ((long)rhs_2 < 0) {
                  pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                          "ERROR: negative shift value");
                  return pEVar6;
                }
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue >> ((byte)rhs_2 & 0x3f));
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_LESS:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue < (long)rhs_2);
                return pEVar6;
              case SYN_BINARY_OP_LESS_EQUAL:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue <= (long)rhs_2);
                return pEVar6;
              case SYN_BINARY_OP_GREATER:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],(long)rhs_2 < rhsValue);
                return pEVar6;
              case SYN_BINARY_OP_GREATER_EQUAL:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],(long)rhs_2 <= rhsValue);
                return pEVar6;
              case SYN_BINARY_OP_EQUAL:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],
                           (ExprBase *)rhsValue == rhs_2);
                return pEVar6;
              case SYN_BINARY_OP_NOT_EQUAL:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],
                           (ExprBase *)rhsValue != rhs_2);
                return pEVar6;
              case SYN_BINARY_OP_BIT_AND:
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue & (ulong)rhs_2);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_BIT_OR:
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue | (ulong)rhs_2);
                return &pEVar3->super_ExprBase;
              case SYN_BINARY_OP_BIT_XOR:
                pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                   ((ExpressionContext *)source_local->_vptr_SynBase);
                ExprIntegerLiteral::ExprIntegerLiteral
                          (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                           rhsValue ^ (ulong)rhs_2);
                return &pEVar3->super_ExprBase;
              default:
                __assert_fail("!\"unexpected type\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                              ,0x32a,
                              "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                             );
              case SYN_BINARY_OP_LOGICAL_XOR:
                pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                    ((ExpressionContext *)source_local->_vptr_SynBase)->
                          super_ExprBase;
                ExprBoolLiteral::ExprBoolLiteral
                          ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                           (TypeBase *)source_local->_vptr_SynBase[0x1138],
                           (rhsValue != 0) != (rhs_2 != (ExprBase *)0x0));
                return pEVar6;
              }
            }
            result = (int)rhsValue;
            power = (uint)rhs_2;
            switch(lhsValue._4_4_) {
            case SYN_BINARY_OP_ADD:
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result + power));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_SUB:
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result - power));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_MUL:
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result * power));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_DIV:
              goto switchD_00301028_caseD_4;
            case SYN_BINARY_OP_MOD:
              if ((uint)rhs_2 == 0) {
                pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                        "ERROR: modulus division by zero during constant folding");
                return pEVar6;
              }
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result % power));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_POW:
              if ((int)(uint)rhs_2 < 0) {
                pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                        "ERROR: negative power on integer number in exponentiation during constant folding"
                                       );
                return pEVar6;
              }
              result_1._4_4_ = 1;
              for (result_1._0_4_ = (uint)rhs_2; (uint)result_1 != 0;
                  result_1._0_4_ = (int)(uint)result_1 >> 1) {
                if (((uint)result_1 & 1) != 0) {
                  result_1._4_4_ = result * result_1._4_4_;
                  result_1._0_4_ = (uint)result_1 - 1;
                }
                result = result * result;
              }
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,(long)result_1._4_4_
                        );
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_SHL:
              if ((int)(uint)rhs_2 < 0) {
                pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                        "ERROR: negative shift value");
                return pEVar6;
              }
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result << ((byte)power & 0x1f)));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_SHR:
              if ((int)(uint)rhs_2 < 0) {
                pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                                        "ERROR: negative shift value");
                return pEVar6;
              }
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result >> ((byte)power & 0x1f)));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_LESS:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],result < power);
              return pEVar6;
            case SYN_BINARY_OP_LESS_EQUAL:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],result <= power);
              return pEVar6;
            case SYN_BINARY_OP_GREATER:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],power < result);
              return pEVar6;
            case SYN_BINARY_OP_GREATER_EQUAL:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],power <= result);
              return pEVar6;
            case SYN_BINARY_OP_EQUAL:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],result == power);
              return pEVar6;
            case SYN_BINARY_OP_NOT_EQUAL:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],result != power);
              return pEVar6;
            case SYN_BINARY_OP_BIT_AND:
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result & power));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_BIT_OR:
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result | power));
              return &pEVar3->super_ExprBase;
            case SYN_BINARY_OP_BIT_XOR:
              pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                                 ((ExpressionContext *)source_local->_vptr_SynBase);
              ExprIntegerLiteral::ExprIntegerLiteral
                        (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                         (long)(result ^ power));
              return &pEVar3->super_ExprBase;
            default:
              __assert_fail("!\"unexpected type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x2de,
                            "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                           );
            case SYN_BINARY_OP_LOGICAL_XOR:
              pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                                  ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase
              ;
              ExprBoolLiteral::ExprBoolLiteral
                        ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                         (TypeBase *)source_local->_vptr_SynBase[0x1138],
                         (result != 0) != (power != 0));
              return pEVar6;
            }
          }
          pEVar6 = Report((ExpressionEvalContext *)source_local,"ERROR: failed to eval binary op");
          return pEVar6;
        }
        __assert_fail("lhs->type == rhs->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x28a,
                      "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                     );
      }
      bVar2 = TryTakeLong(unevaluatedRhs_local,&rhsValue);
      if (bVar2) {
        if (rhsValue == 1) {
          pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                              ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
          ExprBoolLiteral::ExprBoolLiteral
                    ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                     (TypeBase *)source_local->_vptr_SynBase[0x1138],true);
          return pEVar6;
        }
        rhs_1 = Evaluate((ExpressionEvalContext *)source_local,pEStack_30);
        if (rhs_1 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        bVar2 = TryTakeLong(rhs_1,(longlong *)&rhs_2);
        if (bVar2) {
          pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                              ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
          ExprBoolLiteral::ExprBoolLiteral
                    ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                     (TypeBase *)source_local->_vptr_SynBase[0x1138],rhs_2 != (ExprBase *)0x0);
          return pEVar6;
        }
      }
      return (ExprBase *)0x0;
    }
    bVar2 = TryTakeLong(unevaluatedRhs_local,&rhsValue);
    if (bVar2) {
      if (rhsValue == 0) {
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],false);
        return pEVar6;
      }
      rhs_3 = Evaluate((ExpressionEvalContext *)source_local,pEStack_30);
      if (rhs_3 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      bVar2 = TryTakeLong(rhs_3,(longlong *)&rhs_2);
      if (bVar2) {
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhs_2 != (ExprBase *)0x0);
        return pEVar6;
      }
    }
    return (ExprBase *)0x0;
  }
  lhsValue_1 = (double)Evaluate((ExpressionEvalContext *)source_local,pEStack_30);
  if ((ExprBase *)lhsValue_1 == (ExprBase *)0x0) {
    return (ExprBase *)0x0;
  }
  bVar2 = ExpressionContext::IsFloatingPointType
                    ((ExpressionContext *)source_local->_vptr_SynBase,unevaluatedRhs_local->type);
  if ((bVar2) &&
     (bVar2 = ExpressionContext::IsFloatingPointType
                        ((ExpressionContext *)source_local->_vptr_SynBase,
                         *(TypeBase **)((long)lhsValue_1 + 0x18)), bVar2)) {
    if (unevaluatedRhs_local->type != *(TypeBase **)((long)lhsValue_1 + 0x18)) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x33a,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    }
    rhsValue_1 = 0.0;
    lhsValue_2 = (TypeBase *)0x0;
    bVar2 = TryTakeDouble(unevaluatedRhs_local,&rhsValue_1);
    if ((bVar2) && (bVar2 = TryTakeDouble((ExprBase *)lhsValue_1,(double *)&lhsValue_2), bVar2)) {
      switch(lhsValue._4_4_) {
      case SYN_BINARY_OP_ADD:
        pEVar4 = ExpressionContext::get<ExprRationalLiteral>
                           ((ExpressionContext *)source_local->_vptr_SynBase);
        ExprRationalLiteral::ExprRationalLiteral
                  (pEVar4,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                   rhsValue_1 + (double)lhsValue_2);
        return &pEVar4->super_ExprBase;
      case SYN_BINARY_OP_SUB:
        pEVar4 = ExpressionContext::get<ExprRationalLiteral>
                           ((ExpressionContext *)source_local->_vptr_SynBase);
        ExprRationalLiteral::ExprRationalLiteral
                  (pEVar4,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                   rhsValue_1 - (double)lhsValue_2);
        return &pEVar4->super_ExprBase;
      case SYN_BINARY_OP_MUL:
        pEVar4 = ExpressionContext::get<ExprRationalLiteral>
                           ((ExpressionContext *)source_local->_vptr_SynBase);
        ExprRationalLiteral::ExprRationalLiteral
                  (pEVar4,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                   rhsValue_1 * (double)lhsValue_2);
        return &pEVar4->super_ExprBase;
      case SYN_BINARY_OP_DIV:
        pEVar4 = ExpressionContext::get<ExprRationalLiteral>
                           ((ExpressionContext *)source_local->_vptr_SynBase);
        ExprRationalLiteral::ExprRationalLiteral
                  (pEVar4,(SynBase *)lhs_local,unevaluatedRhs_local->type,
                   rhsValue_1 / (double)lhsValue_2);
        return &pEVar4->super_ExprBase;
      case SYN_BINARY_OP_MOD:
        pEVar4 = ExpressionContext::get<ExprRationalLiteral>
                           ((ExpressionContext *)source_local->_vptr_SynBase);
        pEVar6 = lhs_local;
        pTVar1 = unevaluatedRhs_local->type;
        dVar7 = fmod(rhsValue_1,(double)lhsValue_2);
        ExprRationalLiteral::ExprRationalLiteral(pEVar4,(SynBase *)pEVar6,pTVar1,dVar7);
        return &pEVar4->super_ExprBase;
      case SYN_BINARY_OP_POW:
        pEVar4 = ExpressionContext::get<ExprRationalLiteral>
                           ((ExpressionContext *)source_local->_vptr_SynBase);
        pEVar6 = lhs_local;
        pTVar1 = unevaluatedRhs_local->type;
        dVar7 = pow(rhsValue_1,(double)lhsValue_2);
        ExprRationalLiteral::ExprRationalLiteral(pEVar4,(SynBase *)pEVar6,pTVar1,dVar7);
        return &pEVar4->super_ExprBase;
      default:
        __assert_fail("!\"unexpected type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x35c,
                      "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                     );
      case SYN_BINARY_OP_LESS:
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue_1 < (double)lhsValue_2);
        return pEVar6;
      case SYN_BINARY_OP_LESS_EQUAL:
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue_1 <= (double)lhsValue_2)
        ;
        return pEVar6;
      case SYN_BINARY_OP_GREATER:
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],(double)lhsValue_2 < rhsValue_1);
        return pEVar6;
      case SYN_BINARY_OP_GREATER_EQUAL:
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],(double)lhsValue_2 <= rhsValue_1)
        ;
        return pEVar6;
      case SYN_BINARY_OP_EQUAL:
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue_1 == (double)lhsValue_2)
        ;
        return pEVar6;
      case SYN_BINARY_OP_NOT_EQUAL:
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue_1 != (double)lhsValue_2)
        ;
        return pEVar6;
      }
    }
  }
  else if ((unevaluatedRhs_local->type == (TypeBase *)source_local->_vptr_SynBase[0x113f]) &&
          (*(_func_int **)((long)lhsValue_1 + 0x18) == source_local->_vptr_SynBase[0x113f])) {
    rhsValue_2 = (TypeBase *)0x0;
    lPtr = (void *)0x0;
    bVar2 = TryTakeTypeId(unevaluatedRhs_local,&rhsValue_2);
    if ((bVar2) && (bVar2 = TryTakeTypeId((ExprBase *)lhsValue_1,(TypeBase **)&lPtr), bVar2)) {
      if (lhsValue._4_4_ == SYN_BINARY_OP_EQUAL) {
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue_2 == (TypeBase *)lPtr);
        return pEVar6;
      }
      if (lhsValue._4_4_ == SYN_BINARY_OP_NOT_EQUAL) {
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],rhsValue_2 != (TypeBase *)lPtr);
        return pEVar6;
      }
    }
  }
  else {
    bVar2 = isType<TypeRef>(unevaluatedRhs_local->type);
    if ((bVar2) && (bVar2 = isType<TypeRef>(*(TypeBase **)((long)lhsValue_1 + 0x18)), bVar2)) {
      if (unevaluatedRhs_local->type != *(TypeBase **)((long)lhsValue_1 + 0x18)) {
        __assert_fail("lhs->type == rhs->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x371,
                      "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                     );
      }
      bVar2 = isType<ExprNullptrLiteral>(unevaluatedRhs_local);
      if (bVar2) {
        value = (ExprPointerLiteral *)0x0;
      }
      else {
        pEVar5 = getType<ExprPointerLiteral>(unevaluatedRhs_local);
        if (pEVar5 == (ExprPointerLiteral *)0x0) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x37a,
                        "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                       );
        }
        value = (ExprPointerLiteral *)pEVar5->ptr;
      }
      bVar2 = isType<ExprNullptrLiteral>((ExprBase *)lhsValue_1);
      if (bVar2) {
        value_1 = (ExprPointerLiteral *)0x0;
      }
      else {
        pEVar5 = getType<ExprPointerLiteral>((ExprBase *)lhsValue_1);
        if (pEVar5 == (ExprPointerLiteral *)0x0) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,899,
                        "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                       );
        }
        value_1 = (ExprPointerLiteral *)pEVar5->ptr;
      }
      if (lhsValue._4_4_ == SYN_BINARY_OP_EQUAL) {
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],value == value_1);
        return pEVar6;
      }
      if (lhsValue._4_4_ == SYN_BINARY_OP_NOT_EQUAL) {
        pEVar6 = &ExpressionContext::get<ExprBoolLiteral>
                            ((ExpressionContext *)source_local->_vptr_SynBase)->super_ExprBase;
        ExprBoolLiteral::ExprBoolLiteral
                  ((ExprBoolLiteral *)pEVar6,(SynBase *)lhs_local,
                   (TypeBase *)source_local->_vptr_SynBase[0x1138],value != value_1);
        return pEVar6;
      }
    }
  }
  pEVar6 = Report((ExpressionEvalContext *)source_local,"ERROR: failed to eval binary op");
  return pEVar6;
switchD_00301672_caseD_4:
  if (rhs_2 == (ExprBase *)0x0) {
    pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                            "ERROR: division by zero during constant folding");
    return pEVar6;
  }
  pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                     ((ExpressionContext *)source_local->_vptr_SynBase);
  ExprIntegerLiteral::ExprIntegerLiteral
            (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,rhsValue / (long)rhs_2);
  return &pEVar3->super_ExprBase;
switchD_00301028_caseD_4:
  if ((uint)rhs_2 == 0) {
    pEVar6 = ReportCritical((ExpressionEvalContext *)source_local,
                            "ERROR: division by zero during constant folding");
    return pEVar6;
  }
  pEVar3 = ExpressionContext::get<ExprIntegerLiteral>
                     ((ExpressionContext *)source_local->_vptr_SynBase);
  ExprIntegerLiteral::ExprIntegerLiteral
            (pEVar3,(SynBase *)lhs_local,unevaluatedRhs_local->type,(long)(result / power));
  return &pEVar3->super_ExprBase;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionEvalContext &ctx, SynBase *source, ExprBase *lhs, ExprBase *unevaluatedRhs, SynBinaryOpType op)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(unevaluatedRhs->type))
		return Report(ctx, "ERROR: encountered an error node");

	assert(lhs->type == unevaluatedRhs->type);

	if((ctx.ctx.IsIntegerType(lhs->type) || isType<TypeEnum>(lhs->type)) && (ctx.ctx.IsIntegerType(unevaluatedRhs->type) || isType<TypeEnum>(unevaluatedRhs->type)))
	{
		long long lhsValue = 0;
		long long rhsValue = 0;

		// Short-circuit behaviour
		if(op == SYN_BINARY_OP_LOGICAL_AND)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 0)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, false);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		if(op == SYN_BINARY_OP_LOGICAL_OR)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 1)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, true);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

		if(!rhs)
			return NULL;

		assert(lhs->type == rhs->type);

		TypeBase *resultType = ctx.ctx.typeInt;

		if(lhs->type == ctx.ctx.typeLong || rhs->type == ctx.ctx.typeLong)
			resultType = ctx.ctx.typeLong;

		if(TryTakeLong(lhs, lhsValue) && TryTakeLong(rhs, rhsValue))
		{
			if(resultType == ctx.ctx.typeInt)
			{
				int lhsValueInt = int(lhsValue);
				int rhsValueInt = int(rhsValue);

				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt + rhsValueInt);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt - rhsValueInt);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, int(lhsValueInt * rhsValueInt));
				case SYN_BINARY_OP_DIV:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt / rhsValueInt);
				case SYN_BINARY_OP_MOD:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt % rhsValueInt);
				case SYN_BINARY_OP_POW:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					int result, power;

					result = 1;
					power = rhsValueInt;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValueInt;
							power--;
						}
						lhsValueInt *= lhsValueInt;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt << rhsValueInt);
				case SYN_BINARY_OP_SHR:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt >> rhsValueInt);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt < rhsValueInt);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt <= rhsValueInt);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt > rhsValueInt);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt >= rhsValueInt);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt == rhsValueInt);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt != rhsValueInt);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt & rhsValueInt);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt | rhsValueInt);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt ^ rhsValueInt);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValueInt != !!rhsValueInt);
				default:
					assert(!"unexpected type");
					break;
				}
			}
			else
			{
				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue + rhsValue);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue - rhsValue);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue * rhsValue);
				case SYN_BINARY_OP_DIV:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue / rhsValue);
				case SYN_BINARY_OP_MOD:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue % rhsValue);
				case SYN_BINARY_OP_POW:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					long long result, power;

					result = 1;
					power = rhsValue;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValue;
							power--;
						}
						lhsValue *= lhsValue;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue << rhsValue);
				case SYN_BINARY_OP_SHR:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue >> rhsValue);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue & rhsValue);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue | rhsValue);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue ^ rhsValue);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValue != !!rhsValue);
				default:
					assert(!"unexpected type");
					break;
				}
			}
		}

		return Report(ctx, "ERROR: failed to eval binary op");
	}

	ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

	if(!rhs)
		return NULL;

	if(ctx.ctx.IsFloatingPointType(lhs->type) && ctx.ctx.IsFloatingPointType(rhs->type))
	{
		assert(lhs->type == rhs->type);

		double lhsValue = 0;
		double rhsValue = 0;

		if(TryTakeDouble(lhs, lhsValue) && TryTakeDouble(rhs, rhsValue))
		{
			switch(op)
			{
			case SYN_BINARY_OP_ADD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue + rhsValue);
			case SYN_BINARY_OP_SUB:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue - rhsValue);
			case SYN_BINARY_OP_MUL:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue * rhsValue);
			case SYN_BINARY_OP_DIV:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue / rhsValue);
			case SYN_BINARY_OP_MOD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, fmod(lhsValue, rhsValue));
			case SYN_BINARY_OP_POW:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, pow(lhsValue, rhsValue));
			case SYN_BINARY_OP_LESS:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
			case SYN_BINARY_OP_LESS_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
			case SYN_BINARY_OP_GREATER:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
			case SYN_BINARY_OP_GREATER_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
			case SYN_BINARY_OP_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
			case SYN_BINARY_OP_NOT_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
			default:
				assert(!"unexpected type");
				break;
			}
		}
	}
	else if(lhs->type == ctx.ctx.typeTypeID && rhs->type == ctx.ctx.typeTypeID)
	{
		TypeBase *lhsValue = NULL;
		TypeBase *rhsValue = NULL;

		if(TryTakeTypeId(lhs, lhsValue) && TryTakeTypeId(rhs, rhsValue))
		{
			if(op == SYN_BINARY_OP_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);

			if(op == SYN_BINARY_OP_NOT_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
		}
	}
	else if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
	{
		assert(lhs->type == rhs->type);

		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(lhs))
			lPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(lhs))
			lPtr = value->ptr;
		else
			assert(!"unknown type");

		void *rPtr = NULL;

		if(isType<ExprNullptrLiteral>(rhs))
			rPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(rhs))
			rPtr = value->ptr;
		else
			assert(!"unknown type");

		if(op == SYN_BINARY_OP_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr == rPtr);

		if(op == SYN_BINARY_OP_NOT_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr != rPtr);
	}

	return Report(ctx, "ERROR: failed to eval binary op");
}